

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O3

void __thiscall
rlottie::internal::renderer::Group::update
          (Group *this,int frameNo,VMatrix *parentMatrix,float parentAlpha,DirtyFlag *flag)

{
  Group *pGVar1;
  Data *pDVar2;
  pointer ppOVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  bool bVar9;
  Transform *pTVar10;
  uint uVar11;
  Object **content;
  pointer ppOVar12;
  float fVar13;
  float fVar14;
  DirtyFlag newFlag;
  VMatrix m;
  uint local_5c;
  VMatrix local_58;
  
  uVar11 = flag->i;
  pGVar1 = (this->mModel).super_FilterBase<rlottie::internal::model::Group>.model_;
  local_5c = uVar11;
  if ((pGVar1 == (Group *)0x0) || (pGVar1->mTransform == (Transform *)0x0)) {
    *(undefined8 *)((long)&(this->mMatrix).mty + 2) = *(undefined8 *)((long)&parentMatrix->mty + 2);
    fVar5 = parentMatrix->m11;
    fVar6 = parentMatrix->m12;
    fVar7 = parentMatrix->m13;
    fVar8 = parentMatrix->m21;
    fVar13 = parentMatrix->m23;
    fVar14 = parentMatrix->mtx;
    fVar4 = parentMatrix->mty;
    (this->mMatrix).m22 = parentMatrix->m22;
    (this->mMatrix).m23 = fVar13;
    (this->mMatrix).mtx = fVar14;
    (this->mMatrix).mty = fVar4;
    (this->mMatrix).m11 = fVar5;
    (this->mMatrix).m12 = fVar6;
    (this->mMatrix).m13 = fVar7;
    (this->mMatrix).m21 = fVar8;
  }
  else {
    model::Filter<rlottie::internal::model::Group>::matrix(&local_58,&this->mModel,frameNo);
    VMatrix::operator*=(&local_58,parentMatrix);
    if ((((flag->i & 1) == 0) &&
        ((undefined1  [16])
         ((undefined1  [16])
          (((this->mModel).super_FilterBase<rlottie::internal::model::Group>.model_)->mTransform->
          super_Object).field_0 & (undefined1  [16])0x100000000000000) == (undefined1  [16])0x0)) &&
       (bVar9 = VMatrix::operator!=(&local_58,&this->mMatrix), bVar9)) {
      uVar11 = uVar11 | 1;
      local_5c = uVar11;
    }
    *(ulong *)((long)&(this->mMatrix).mty + 2) = CONCAT62(local_58._32_6_,local_58.mty._2_2_);
    (this->mMatrix).m22 = local_58.m22;
    (this->mMatrix).m23 = local_58.m23;
    (this->mMatrix).mtx = (float)local_58.mtx;
    (this->mMatrix).mty = (float)(int)(CONCAT26(local_58.mty._2_2_,local_58._24_6_) >> 0x20);
    (this->mMatrix).m11 = local_58.m11;
    (this->mMatrix).m12 = local_58.m12;
    (this->mMatrix).m13 = local_58.m13;
    (this->mMatrix).m21 = local_58.m21;
    pGVar1 = (this->mModel).super_FilterBase<rlottie::internal::model::Group>.model_;
    if (pGVar1 == (Group *)0x0) {
      pTVar10 = (Transform *)0x0;
    }
    else {
      pTVar10 = pGVar1->mTransform;
    }
    if ((undefined1  [16])
        ((undefined1  [16])(pTVar10->super_Object).field_0 & (undefined1  [16])0x100000000000000) ==
        (undefined1  [16])0x0) {
      pDVar2 = (pTVar10->impl).mData;
      if ((pDVar2->mOpacity).isValue_ == true) {
        fVar13 = (pDVar2->mOpacity).impl_.value_;
      }
      else {
        fVar13 = model::KeyFrames<float,_void>::value((pDVar2->mOpacity).impl_,frameNo);
      }
      fVar13 = fVar13 / 100.0;
    }
    else {
      fVar13 = (pTVar10->impl).mStaticData.mOpacity;
    }
    fVar13 = fVar13 * parentAlpha;
    fVar14 = fVar13 - parentAlpha;
    parentAlpha = fVar13;
    if (1e-06 <= ABS(fVar14)) {
      local_5c = uVar11 | 2;
    }
  }
  ppOVar12 = (this->mContents).
             super__Vector_base<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppOVar3 = (this->mContents).
            super__Vector_base<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppOVar12 != ppOVar3) {
    do {
      (*(*ppOVar12)->_vptr_Object[2])(parentAlpha,*ppOVar12,frameNo,&this->mMatrix,&local_5c);
      ppOVar12 = ppOVar12 + 1;
    } while (ppOVar12 != ppOVar3);
  }
  return;
}

Assistant:

void renderer::Group::update(int frameNo, const VMatrix &parentMatrix,
                             float parentAlpha, const DirtyFlag &flag)
{
    DirtyFlag newFlag = flag;
    float     alpha;

    if (mModel.hasModel() && mModel.transform()) {
        VMatrix m = mModel.matrix(frameNo);

        m *= parentMatrix;
        if (!(flag & DirtyFlagBit::Matrix) && !mModel.transform()->isStatic() &&
            (m != mMatrix)) {
            newFlag |= DirtyFlagBit::Matrix;
        }

        mMatrix = m;

        alpha = parentAlpha * mModel.transform()->opacity(frameNo);
        if (!vCompare(alpha, parentAlpha)) {
            newFlag |= DirtyFlagBit::Alpha;
        }
    } else {
        mMatrix = parentMatrix;
        alpha = parentAlpha;
    }

    for (const auto &content : mContents) {
        content->update(frameNo, matrix(), alpha, newFlag);
    }
}